

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O2

void Saig_ManBmcCreateCnf_iter(Gia_ManBmc_t *p,Aig_Obj_t *pObj,int iFrame,Vec_Int_t *vVisit)

{
  Aig_Man_t *p_00;
  int iVar1;
  uint uVar2;
  Aig_Obj_t *pAVar3;
  int *piVar4;
  uint uVar5;
  long lVar6;
  
  while( true ) {
    iVar1 = Saig_ManBmcLiteral(p,pObj,iFrame);
    if (iVar1 != -1) {
      return;
    }
    p_00 = p->pAig;
    iVar1 = p_00->nTravIds;
    if (pObj->TravId == iVar1) {
      return;
    }
    pObj->TravId = iVar1;
    uVar2 = (uint)*(undefined8 *)&pObj->field_0x18;
    uVar5 = uVar2 & 7;
    if (uVar5 != 3) break;
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
  }
  if (uVar5 != 2) {
    if (0xfffffffd < (uVar2 & 7) - 7) {
      piVar4 = Saig_ManBmcMapping(p,pObj);
      for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
        if (piVar4[lVar6 + 1] != -1) {
          pAVar3 = Aig_ManObj(p->pAig,piVar4[lVar6 + 1]);
          Saig_ManBmcCreateCnf_iter(p,pAVar3,iFrame,vVisit);
        }
      }
      return;
    }
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                  ,0x488,
                  "void Saig_ManBmcCreateCnf_iter(Gia_ManBmc_t *, Aig_Obj_t *, int, Vec_Int_t *)");
  }
  iVar1 = Saig_ObjIsLo(p_00,pObj);
  if (iVar1 == 0) {
    return;
  }
  pAVar3 = Saig_ObjLoToLi(p->pAig,pObj);
  Vec_IntPush(vVisit,pAVar3->Id);
  return;
}

Assistant:

void Saig_ManBmcCreateCnf_iter( Gia_ManBmc_t * p, Aig_Obj_t * pObj, int iFrame, Vec_Int_t * vVisit )
{
    if ( Saig_ManBmcLiteral( p, pObj, iFrame ) != ~0 )
        return; 
    if ( Aig_ObjIsTravIdCurrent(p->pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p->pAig, pObj);
    if ( Aig_ObjIsCi(pObj) )
    {
        if ( Saig_ObjIsLo(p->pAig, pObj) )
            Vec_IntPush( vVisit, Saig_ObjLoToLi(p->pAig, pObj)->Id );
        return;
    }
    if ( Aig_ObjIsCo(pObj) )
    {
        Saig_ManBmcCreateCnf_iter( p, Aig_ObjFanin0(pObj), iFrame, vVisit );
        return;
    }
    else
    {
        int * pMapping, i;
        assert( Aig_ObjIsNode(pObj) );
        pMapping = Saig_ManBmcMapping( p, pObj );
        for ( i = 0; i < 4; i++ )
            if ( pMapping[i+1] != -1 )
                Saig_ManBmcCreateCnf_iter( p, Aig_ManObj(p->pAig, pMapping[i+1]), iFrame, vVisit );
    }
}